

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

size_t mpack_expect_bin_buf(mpack_reader_t *reader,char *buf,size_t bufsize)

{
  uint32_t uVar1;
  ulong __n;
  
  uVar1 = mpack_expect_bin(reader);
  if (reader->error == mpack_ok) {
    __n = (ulong)uVar1;
    if (__n <= bufsize) {
      if ((ulong)((long)reader->end - (long)reader->data) < __n) {
        mpack_read_native_straddle(reader,buf,__n);
      }
      else {
        memcpy(buf,reader->data,__n);
        reader->data = reader->data + __n;
      }
      if (reader->error != mpack_ok) {
        return 0;
      }
      return __n;
    }
    reader->error = mpack_error_too_big;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_too_big);
    }
  }
  return 0;
}

Assistant:

size_t mpack_expect_bin_buf(mpack_reader_t* reader, char* buf, size_t bufsize) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t binsize = mpack_expect_bin(reader);
    if (mpack_reader_error(reader))
        return 0;
    if (binsize > bufsize) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return 0;
    }
    mpack_read_bytes(reader, buf, binsize);
    if (mpack_reader_error(reader))
        return 0;
    mpack_done_bin(reader);
    return binsize;
}